

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_socket_close(nng_socket s)

{
  int iVar1;
  nni_sock *in_RAX;
  nni_sock *local_18;
  nni_sock *sock;
  
  local_18 = in_RAX;
  iVar1 = nni_sock_find(&local_18,s.id);
  if (iVar1 == 0) {
    nni_sock_close(local_18);
  }
  return iVar1;
}

Assistant:

int
nng_socket_close(nng_socket s)
{
	int       rv;
	nni_sock *sock;

	// Close is special, because we still want to be able to get
	// a hold on the socket even if shutdown was called.
	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}
	// No release -- close releases it.
	nni_sock_close(sock);
	return (0);
}